

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O1

Direction * __thiscall
iDynTree::Direction::reverse(Direction *__return_storage_ptr__,Direction *this)

{
  Direction(__return_storage_ptr__,-(this->super_Vector3).m_data[0],-(this->super_Vector3).m_data[1]
            ,-(this->super_Vector3).m_data[2]);
  return __return_storage_ptr__;
}

Assistant:

Direction Direction::reverse() const
    {
        return Direction(-this->m_data[0],
                         -this->m_data[1],
                         -this->m_data[2]);
    }